

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::IsAnyOffsetsAreInvalid(OffsetData *offset_data)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  uint local_24;
  uint local_20;
  uint dx;
  uint dy;
  uint l;
  OffsetData *offset_data_local;
  
  dx = 0;
  do {
    sVar1 = std::
            vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::size(&offset_data->offsets);
    if (sVar1 <= dx) {
      return false;
    }
    local_20 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator[](&offset_data->offsets,(ulong)dx);
      sVar1 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size(pvVar2);
      if (sVar1 <= local_20) break;
      local_24 = 0;
      while( true ) {
        pvVar2 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](&offset_data->offsets,(ulong)dx);
        pvVar3 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar2,(ulong)local_20);
        sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar3);
        if (sVar1 <= local_24) break;
        pvVar2 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](&offset_data->offsets,(ulong)dx);
        pvVar3 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar2,(ulong)local_20);
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar3,(ulong)local_24);
        if ((long)*pvVar4 < 1) {
          return true;
        }
        local_24 = local_24 + 1;
      }
      local_20 = local_20 + 1;
    }
    dx = dx + 1;
  } while( true );
}

Assistant:

static bool IsAnyOffsetsAreInvalid(const OffsetData& offset_data) {
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx)
        if (reinterpret_cast<const tinyexr::tinyexr_int64&>(offset_data.offsets[l][dy][dx]) <= 0)
          return true;

  return false;
}